

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_clock_linux.c
# Opt level: O1

int os_clock_linux_gettime64_ns(uint64_t *t64)

{
  int iVar1;
  timespec ts;
  timespec local_18;
  
  if (_clock_source == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = clock_gettime(_clock_source,&local_18);
    if (iVar1 == 0) {
      *t64 = local_18.tv_sec * 1000000000 + local_18.tv_nsec;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
os_clock_linux_gettime64_ns(uint64_t *t64) {
  int error;

#if defined(CLOCK_MONOTONIC_RAW) || defined(CLOCK_MONOTONIC)
  if (_clock_source) {
    struct timespec ts;

    if ((error = clock_gettime(_clock_source, &ts)) != 0) {
      return error;
    }

    *t64 = 1000000000ull * ts.tv_sec + ts.tv_nsec;
    return 0;
  }
#endif
  return -1;
}